

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringStd.cpp
# Opt level: O2

void testStringStd(int iterations)

{
  __type _Var1;
  int iVar2;
  long lVar3;
  int iVar4;
  bool bVar5;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string blah [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  srand(100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)blah,
             "12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678",
             (allocator<char> *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(blah + 1),
             "12345688 12345688 12345688 12345688 12345688 12345688 12345688 12345688 12345688",
             (allocator<char> *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(blah + 2),
             "12345698 12345698 12345698 12345698 12345698 12345698 12345698 12345698 12345698",
             &local_d9);
  iVar4 = 0;
  if (0 < iterations) {
    iVar4 = iterations;
  }
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               "12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678",
               (allocator<char> *)&local_d8);
    iVar2 = rand();
    _Var1 = std::operator==(&local_50,blah + iVar2 % 3);
    std::__cxx11::string::~string((string *)&local_50);
    if (_Var1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,
                 "12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678",
                 &local_d9);
      iVar2 = rand();
      std::operator+(&local_50,&local_d8,blah + iVar2 % 3);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_d8);
    }
  }
  lVar3 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&blah[0]._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  return;
}

Assistant:

void testStringStd(int iterations)
{
  srand(100);
  size_t val = 0;
  std::string blah[] = {
    "12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678",
    "12345688 12345688 12345688 12345688 12345688 12345688 12345688 12345688 12345688",
    "12345698 12345698 12345698 12345698 12345698 12345698 12345698 12345698 12345698"
  };
  for (int i = 0; i < iterations; ++i)
  {
    if(std::string("12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678") == blah[rand() % 3])
      val += (std::string("12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678") + blah[rand() % 3]).length();
  }
}